

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

bool __thiscall
math::wide_integer::uintwide_t<131072u,unsigned_int,std::allocator<void>,false>::wr_string<char*>
          (uintwide_t<131072u,unsigned_int,std::allocator<void>,false> *this,char *str_result,
          uint_fast8_t base_rep,bool show_base,bool show_pos,bool is_uppercase,
          unsigned_fast_type field_width,char fill_char_str)

{
  byte *pbVar1;
  char cVar2;
  uint uVar3;
  void *pvVar4;
  ulong uVar5;
  unsigned_fast_type uVar6;
  int iVar7;
  undefined7 in_register_00000011;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  undefined4 uVar12;
  undefined7 in_register_00000081;
  bool bVar13;
  uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> tmp;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> local_a0;
  void *local_88;
  undefined4 local_7c;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> local_78;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> local_60;
  uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> local_48;
  
  iVar7 = (int)CONCAT71(in_register_00000011,base_rep);
  uVar12 = (undefined4)CONCAT71(in_register_00000081,show_pos);
  if (iVar7 == 0x10) {
    local_7c = uVar12;
    util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
    dynamic_array(&local_a0,
                  (dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                  this);
    local_a0._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f7d8;
    pvVar4 = operator_new(0x8008);
    memset(pvVar4,0,0x8008);
    bVar13 = (ulong)local_a0.elem_count == 0;
    if ((!bVar13) && (*local_a0.elems == 0)) {
      lVar10 = 4;
      do {
        bVar13 = (ulong)local_a0.elem_count << 2 == lVar10;
        if (bVar13) break;
        pbVar1 = (byte *)((long)local_a0.elems + lVar10);
        lVar10 = lVar10 + 4;
      } while (*(int *)pbVar1 == 0);
    }
    if (bVar13) {
      *(undefined1 *)((long)pvVar4 + 0x8006) = 0x30;
      uVar5 = 0x8006;
    }
    else {
      uVar6 = uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::
              extract_hex_digits<false,_nullptr>
                        ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)&local_a0
                         ,(char *)((long)pvVar4 + 0x8007),is_uppercase);
      uVar5 = 0x8007 - uVar6;
    }
    if ((show_base) && (1 < (long)uVar5)) {
      *(byte *)((long)pvVar4 + (ulong)((int)uVar5 - 1)) = !is_uppercase << 5 | 0x58;
      uVar5 = uVar5 - 2;
      *(undefined1 *)((long)pvVar4 + (uVar5 & 0xffffffff)) = 0x30;
    }
    if (((char)local_7c != '\0') && (0 < (long)uVar5)) {
      uVar5 = uVar5 - 1;
      *(undefined1 *)((long)pvVar4 + (uVar5 & 0xffffffff)) = 0x2b;
    }
    if (field_width != 0) {
      lVar10 = 0;
      if (field_width < 0x8008) {
        lVar10 = 0x8007 - field_width;
      }
      while (lVar10 < (long)uVar5) {
        uVar5 = uVar5 - 1;
        *(char *)((long)pvVar4 + (uVar5 & 0xffffffff)) = fill_char_str;
      }
    }
    *(undefined1 *)((long)pvVar4 + 0x8007) = 0;
    lVar10 = 0;
    do {
      cVar2 = *(char *)((long)pvVar4 + lVar10 + uVar5);
      str_result[lVar10] = cVar2;
      lVar10 = lVar10 + 1;
    } while (cVar2 != '\0');
    uVar5 = 0x8008;
  }
  else if (iVar7 == 10) {
    local_7c = uVar12;
    util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
    dynamic_array(&local_a0,
                  (dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                  this);
    local_a0._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f7d8;
    pvVar4 = operator_new(0x9a26);
    local_88 = pvVar4;
    memset(pvVar4,0,0x9a26);
    bVar13 = (ulong)local_a0.elem_count == 0;
    if ((!bVar13) && (*local_a0.elems == 0)) {
      lVar10 = 4;
      do {
        bVar13 = (ulong)local_a0.elem_count << 2 == lVar10;
        if (bVar13) break;
        pbVar1 = (byte *)((long)local_a0.elems + lVar10);
        lVar10 = lVar10 + 4;
      } while (*(int *)pbVar1 == 0);
    }
    if (!bVar13) {
      uVar5 = 0x9a25;
      do {
        bVar13 = (ulong)local_a0.elem_count == 0;
        if ((!bVar13) && (*local_a0.elems == 0)) {
          lVar10 = 4;
          do {
            bVar13 = (ulong)local_a0.elem_count << 2 == lVar10;
            if (bVar13) break;
            pbVar1 = (byte *)((long)local_a0.elems + lVar10);
            lVar10 = lVar10 + 4;
          } while (*(int *)pbVar1 == 0);
        }
        uVar9 = uVar5 - 1;
        if ((uVar5 == 0) || (bVar13)) goto LAB_0013c8a4;
        util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
        dynamic_array(&local_60,&local_a0);
        local_60._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f7d8;
        lVar10 = 0x3ffc;
        uVar8 = 0;
        uVar5 = 0;
        do {
          uVar5 = CONCAT44((int)uVar5 + (int)uVar8 * -10,
                           *(undefined4 *)((long)local_a0.elems + lVar10));
          uVar8 = uVar5 / 10;
          *(int *)((long)local_a0.elems + lVar10) = (int)uVar8;
          lVar10 = lVar10 + -4;
        } while (lVar10 != -4);
        util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
        dynamic_array(&local_78,&local_a0);
        local_78._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f7d8;
        lVar10 = 0;
        uVar5 = 0;
        do {
          uVar5 = uVar5 + (ulong)local_78.elems[lVar10] * 10;
          local_78.elems[lVar10] = (value_type)uVar5;
          uVar5 = uVar5 >> 0x20;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x1000);
        operator-(&local_48,
                  (uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)&local_60,
                  (uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)&local_78);
        *(char *)((long)local_88 + (uVar9 & 0xffffffff)) =
             (char)*local_48.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    .elems + '0';
        local_48.values.
        super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
        _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
        if ((ulong)local_48.values.
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elem_count != 0) {
          operator_delete(local_48.values.
                          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                          .elems,(ulong)local_48.values.
                                        super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                        .elem_count << 2);
        }
        local_78._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
        if ((ulong)local_78.elem_count != 0) {
          operator_delete(local_78.elems,(ulong)local_78.elem_count << 2);
        }
        local_60._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
        uVar5 = uVar9;
        if ((ulong)local_60.elem_count != 0) {
          operator_delete(local_60.elems,(ulong)local_60.elem_count << 2);
        }
      } while( true );
    }
    *(undefined1 *)((long)local_88 + 0x9a24) = 0x30;
    uVar5 = 0x9a24;
LAB_0013c8a4:
    if ((char)local_7c == '\x01' && 0 < (long)uVar5) {
      uVar5 = uVar5 - 1;
      *(undefined1 *)((long)local_88 + (uVar5 & 0xffffffff)) = 0x2b;
    }
    if (field_width != 0) {
      lVar10 = 0;
      if (field_width < 0x9a26) {
        lVar10 = 0x9a25 - field_width;
      }
      while (lVar10 < (long)uVar5) {
        uVar5 = uVar5 - 1;
        *(char *)((long)local_88 + (uVar5 & 0xffffffff)) = fill_char_str;
      }
    }
    *(undefined1 *)((long)local_88 + 0x9a25) = 0;
    lVar10 = 0;
    do {
      cVar2 = *(char *)((long)pvVar4 + lVar10 + uVar5);
      str_result[lVar10] = cVar2;
      lVar10 = lVar10 + 1;
    } while (cVar2 != '\0');
    uVar5 = 0x9a26;
    pvVar4 = local_88;
  }
  else {
    if (iVar7 != 8) {
      return false;
    }
    util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
    dynamic_array(&local_a0,
                  (dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                  this);
    local_a0._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f7d8;
    pvVar4 = operator_new(0xaab3);
    memset(pvVar4,0,0xaab3);
    bVar13 = (ulong)local_a0.elem_count == 0;
    if ((!bVar13) && (*local_a0.elems == 0)) {
      lVar10 = 4;
      do {
        bVar13 = (ulong)local_a0.elem_count << 2 == lVar10;
        if (bVar13) break;
        pbVar1 = (byte *)((long)local_a0.elems + lVar10);
        lVar10 = lVar10 + 4;
      } while (*(int *)pbVar1 == 0);
    }
    if (!bVar13) {
      uVar5 = 0xaab2;
      do {
        bVar13 = (ulong)local_a0.elem_count == 0;
        if ((!bVar13) && (*local_a0.elems == 0)) {
          lVar10 = 4;
          do {
            bVar13 = (ulong)local_a0.elem_count << 2 == lVar10;
            if (bVar13) break;
            pbVar1 = (byte *)((long)local_a0.elems + lVar10);
            lVar10 = lVar10 + 4;
          } while (*(int *)pbVar1 == 0);
        }
        uVar9 = uVar5 - 1;
        if ((uVar5 == 0) || (bVar13)) goto LAB_0013c795;
        *(byte *)((long)pvVar4 + (uVar9 & 0xffffffff)) = (byte)*local_a0.elems & 7 | 0x30;
        uVar11 = 0;
        lVar10 = 0x3ffc;
        do {
          uVar3 = *(uint *)((long)local_a0.elems + lVar10);
          *(uint *)((long)local_a0.elems + lVar10) = uVar3 >> 3 | uVar11;
          uVar11 = uVar3 << 0x1d;
          lVar10 = lVar10 + -4;
          uVar5 = uVar9;
        } while (lVar10 != -4);
      } while( true );
    }
    *(undefined1 *)((long)pvVar4 + 0xaab1) = 0x30;
    uVar5 = 0xaab1;
LAB_0013c795:
    if (show_base && 0 < (long)uVar5) {
      uVar5 = uVar5 - 1;
      *(undefined1 *)((long)pvVar4 + (uVar5 & 0xffffffff)) = 0x30;
    }
    if (show_pos && 0 < (long)uVar5) {
      uVar5 = uVar5 - 1;
      *(undefined1 *)((long)pvVar4 + (uVar5 & 0xffffffff)) = 0x2b;
    }
    if (field_width != 0) {
      lVar10 = 0;
      if (field_width < 0xaab3) {
        lVar10 = 0xaab2 - field_width;
      }
      while (lVar10 < (long)uVar5) {
        uVar5 = uVar5 - 1;
        *(char *)((long)pvVar4 + (uVar5 & 0xffffffff)) = fill_char_str;
      }
    }
    *(undefined1 *)((long)pvVar4 + 0xaab2) = 0;
    lVar10 = 0;
    do {
      cVar2 = *(char *)((long)pvVar4 + lVar10 + uVar5);
      str_result[lVar10] = cVar2;
      lVar10 = lVar10 + 1;
    } while (cVar2 != '\0');
    uVar5 = 0xaab3;
  }
  operator_delete(pvVar4,uVar5);
  local_a0._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
  if ((ulong)local_a0.elem_count != 0) {
    operator_delete(local_a0.elems,(ulong)local_a0.elem_count << 2);
  }
  return true;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }